

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O2

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
improvePath(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
            *this)

{
  double *pdVar1;
  int *piVar2;
  element_type *peVar3;
  pointer pHVar4;
  ostream *poVar5;
  long lVar6;
  mapped_type *pmVar7;
  bool bVar8;
  char *pcVar9;
  long lVar10;
  double dVar11;
  SearchVertexPtr least_cost_vertex;
  __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  local_80;
  double local_70;
  Heap<double> local_68;
  _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_50;
  _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_80._M_ptr._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->anytime_stats_).num_expansions_,(int *)&local_80);
  poVar5 = std::operator<<((ostream *)&std::cout,"[AMHAStar::improvePath] Improve path iteration: ")
  ;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  local_68.data_.
  super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)&(this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).open_;
  local_50 = (_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&this->closed_inad_;
  local_48 = (_Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&(this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).closed_;
  do {
    csbpl_common::Heap<double>::top((Heap<double> *)&local_80);
    dVar11 = *(double *)CONCAT44(local_80._M_ptr._4_4_,local_80._M_ptr._0_4_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    if (dVar11 == INFINITY) {
      bVar8 = true;
      if ((int)((ulong)((long)(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).open_.data_.
                              super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->
                             super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                             ).open_.data_.
                             super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) == 0) {
        pcVar9 = "[AMHAStar::improvePath] Open list is empty! Error... ";
        bVar8 = false;
LAB_00104505:
        poVar5 = std::operator<<((ostream *)&std::cout,pcVar9);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      return bVar8;
    }
    lVar6 = std::chrono::_V2::system_clock::now();
    dVar11 = (double)(lVar6 - (this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).params_.start_time_.__d.__r) / 1000000000.0;
    pdVar1 = &(this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.time_limit_;
    if (*pdVar1 <= dVar11 && dVar11 != *pdVar1) {
      bVar8 = false;
      pcVar9 = "[AMHAStar::improvePath] Time limit exceeded... Exiting!";
      goto LAB_00104505;
    }
    lVar6 = 0;
    for (lVar10 = 0;
        lVar10 < (this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.num_inad_; lVar10 = lVar10 + 1) {
      pHVar4 = (this->open_inad_).
               super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)(*(long *)((long)&(pHVar4->data_).
                                         super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + lVar6) -
                       *(long *)((long)&(pHVar4->data_).
                                        super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar6)) >> 4) <
          1) {
LAB_0010437b:
        dVar11 = ((this->
                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ).goal_vertex_.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->g_cost_;
        csbpl_common::Heap<double>::top((Heap<double> *)&local_80);
        local_70 = *(double *)CONCAT44(local_80._M_ptr._4_4_,local_80._M_ptr._0_4_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        if (dVar11 < local_70) {
LAB_001044fc:
          bVar8 = true;
          pcVar9 = "[AMHAStar::improvePath] Goal node expanded. Premature termiation!";
          goto LAB_00104505;
        }
        csbpl_common::Heap<double>::top(&local_68);
        std::
        static_pointer_cast<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,csbpl_common::Heap<double>::Element>
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)&local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_68.data_.
                    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        (*(this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          ._vptr_Dijkstra[3])(this,&local_80);
        pmVar7 = std::__detail::
                 _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_48,(key_type *)
                                       (CONCAT44(local_80._M_ptr._4_4_,local_80._M_ptr._0_4_) + 0x10
                                       ));
        *pmVar7 = true;
        piVar2 = (this->anytime_stats_).num_expansions_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish + -1;
        *piVar2 = *piVar2 + 1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      }
      else {
        csbpl_common::Heap<double>::top((Heap<double> *)&local_80);
        local_70 = *(double *)CONCAT44(local_80._M_ptr._4_4_,local_80._M_ptr._0_4_);
        dVar11 = (this->
                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                 ).params_.mha_eps_;
        csbpl_common::Heap<double>::top(&local_68);
        peVar3 = ((local_68.data_.
                   super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_68.data_.
                    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        if (dVar11 * (double)peVar3 < local_70) goto LAB_0010437b;
        dVar11 = ((this->
                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                  ).goal_vertex_.
                  super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->g_cost_;
        csbpl_common::Heap<double>::top((Heap<double> *)&local_80);
        local_70 = *(double *)CONCAT44(local_80._M_ptr._4_4_,local_80._M_ptr._0_4_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        if (dVar11 < local_70) goto LAB_001044fc;
        csbpl_common::Heap<double>::top((Heap<double> *)&stack0xffffffffffffffc0);
        std::
        static_pointer_cast<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,csbpl_common::Heap<double>::Element>
                  ((shared_ptr<csbpl_common::Heap<double>::Element> *)&local_68);
        std::
        __shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_80,
                       (__shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                        *)&local_68.data_.
                           super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[4].
                           super___shared_ptr<csbpl_common::Heap<double>::Element,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_68.data_.
                    super__Vector_base<std::shared_ptr<csbpl_common::Heap<double>::Element>,_std::allocator<std::shared_ptr<csbpl_common::Heap<double>::Element>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        (*(this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          ._vptr_Dijkstra[3])(this,&local_80);
        pmVar7 = std::__detail::
                 _Map_base<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>,_std::__detail::_Select1st,_sliding_puzzle::SlidingPuzzleState::Compare,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_50,(key_type *)
                                       (CONCAT44(local_80._M_ptr._4_4_,local_80._M_ptr._0_4_) + 0x10
                                       ));
        *pmVar7 = true;
        piVar2 = (this->anytime_stats_).num_expansions_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish + -1;
        *piVar2 = *piVar2 + 1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      }
      lVar6 = lVar6 + 0x18;
    }
  } while( true );
}

Assistant:

virtual bool improvePath()
    {
#if DEBUG
      int num_expansions = 0;
  double nearest_node_to_goal_dist = std::numeric_limits<double>::infinity();
  SearchVertexPtr nearest_node_to_goal;
#endif
      this->anytime_stats_.num_expansions_.push_back(0);
      std::cout << "[AMHAStar::improvePath] Improve path iteration: "
                << this->anytime_stats_.num_expansions_.size() << std::endl;
      while (this->open_.top()->key_ < std::numeric_limits<double>::infinity())
      {
        
        double time_elapsed =
          duration_cast<duration<double> >(Clock::now() -
                                           this->params_.start_time_).count();
        
        if (time_elapsed > this->params_.time_limit_)
        {
          std::cout << "[AMHAStar::improvePath] Time limit exceeded..."
                       " Exiting!" << std::endl;
          return false;
        }
        
        for (int i=0; i<this->params_.num_inad_; ++i)
        {
          if (open_inad_[i].size() > 0 &&
              open_inad_[i].top()->key_ <= this->params_.mha_eps_*this->open_.top()->key_)
          {
            if (this->goal_vertex_->g_cost_ < open_inad_[i].top()->key_)
            {
              std::cout << "[AMHAStar::improvePath] Goal node expanded. "
                           "Premature termiation!" << std::endl;
              return true;
            }
            else
            {
              SearchVertexPtr least_cost_vertex =
                std::static_pointer_cast<SearchVertex>(open_inad_[i].top())->self_ptr_;
              expand(least_cost_vertex);
              closed_inad_[least_cost_vertex->state_] = true;
              ++this->anytime_stats_.num_expansions_.back();
#if DEBUG
              ++num_expansions;
#endif
            }
          }
          else
          {
            if (this->goal_vertex_->g_cost_ < this->open_.top()->key_)
            {
              std::cout << "[AMHAStar::improvePath] Goal node expanded. "
                           "Premature termiation!" << std::endl;
              return true;
            }
            else
            {
              SearchVertexPtr least_cost_vertex =
                std::static_pointer_cast<SearchVertex>(this->open_.top());
              expand(least_cost_vertex);
              this->closed_[least_cost_vertex->state_] = true;
              ++this->anytime_stats_.num_expansions_.back();
#if DEBUG
              ++num_expansions;
#endif
            }
          }
        }
      }

#if DEBUG
      std::cout << "[AMHAStar::improvePath] Total number of expansions: "
                << num_expansions << std::endl;
#endif
      
      
      if (this->open_.size() == 0)
      {
#if DEBUG
        std::cout << "[AMHAStar::improvePath] Open list is empty! Error... "
                     "Returning nearest node reached" << std::endl;
        this->env_ptr_->goal_ = nearest_node_to_goal->state_;
        return true;
#endif
        std::cout << "[AMHAStar::improvePath] Open list is empty! Error... " << std::endl;
        return false;
      }
      
      return true;
    }